

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O2

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDVertexPtr vptr,ON_SubDEdge *active_edge,
          ON_SubDFace *active_face)

{
  bool bVar1;
  uint uVar2;
  ON_SubDVertex *this_00;
  ON_SubDEdgePtr eptr;
  ON_SubDFace *f;
  anon_union_8_3_6bf0bb0e_for_m_p0 local_40;
  ON_SubDVertexPtr local_38;
  ON_SubDComponentId local_30;
  
  this->m_cid = ON_SubDComponentId::Unset;
  (this->m_p0).eptr_s = 0.0;
  (this->m_p1).f_corner_t = 0.0;
  local_38.m_ptr = vptr.m_ptr;
  ON_SubDComponentId::ON_SubDComponentId(&local_30,vptr);
  bVar1 = Internal_Init(this,local_30);
  if (bVar1) {
    this_00 = ON_SubDVertexPtr::Vertex(&local_38);
    if (this_00 != (ON_SubDVertex *)0x0) {
      if (active_edge != (ON_SubDEdge *)0x0) {
        uVar2 = ON_SubDVertex::EdgeArrayIndex(this_00,active_edge);
        eptr = ON_SubDVertex::EdgePtr(this_00,uVar2);
        ON_SubDComponentId::ON_SubDComponentId(&local_40.v_active_e,eptr);
        this->m_p0 = local_40;
      }
      if (active_face != (ON_SubDFace *)0x0) {
        uVar2 = ON_SubDVertex::FaceArrayIndex(this_00,active_face);
        f = ON_SubDVertex::Face(this_00,uVar2);
        ON_SubDComponentId::ON_SubDComponentId(&local_40.v_active_e,f);
        this->m_p1 = (anon_union_8_3_7b68a318_for_m_p1)local_40;
      }
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(
  const ON_SubDVertexPtr vptr,
  const class ON_SubDEdge* active_edge,
  const class ON_SubDFace* active_face
)
{
  if (Internal_Init(ON_SubDComponentId(vptr)))
  {
    const ON_SubDVertex* v = vptr.Vertex();
    if (nullptr != v)
    {
      if (nullptr != active_edge)
      {
        const int vei = v->EdgeArrayIndex(active_edge);
        m_p0.v_active_e = ON_SubDComponentId(v->EdgePtr(vei));
      }
      if (nullptr != active_face)
      {
        const int vfi = v->FaceArrayIndex(active_face);
        m_p1.v_active_f = ON_SubDComponentId(v->Face(vfi));
      }
    }
  }
}